

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void hermite_poly_phys(int n,double x,double *cx)

{
  ulong uVar1;
  double dVar2;
  
  if ((-1 < n) && (*cx = 1.0, n != 0)) {
    cx[1] = x + x;
    if (1 < n) {
      dVar2 = cx[1];
      uVar1 = 2;
      do {
        dVar2 = dVar2 * (x + x) + (double)((int)uVar1 + -1) * -2.0 * cx[uVar1 - 2];
        cx[uVar1] = dVar2;
        uVar1 = uVar1 + 1;
      } while (n + 1 != uVar1);
    }
  }
  return;
}

Assistant:

BURKHARDT_EXPORT
void hermite_poly_phys ( int n, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_POLY_PHYS evaluates the physicist's Hermite polynomials at X.
//
//  Differential equation:
//
//    Y'' - 2 X Y' + 2 N Y = 0
//
//  First terms:
//
//      1
//      2 X
//      4 X^2     -  2
//      8 X^3     - 12 X
//     16 X^4     - 48 X^2     + 12
//     32 X^5    - 160 X^3    + 120 X
//     64 X^6    - 480 X^4    + 720 X^2    - 120
//    128 X^7   - 1344 X^5   + 3360 X^3   - 1680 X
//    256 X^8   - 3584 X^6  + 13440 X^4  - 13440 X^2   + 1680
//    512 X^9   - 9216 X^7  + 48384 X^5  - 80640 X^3  + 30240 X
//   1024 X^10 - 23040 X^8 + 161280 X^6 - 403200 X^4 + 302400 X^2 - 30240
//
//  Recursion:
//
//    H(0,X) = 1,
//    H(1,X) = 2*X,
//    H(N,X) = 2*X * H(N-1,X) - 2*(N-1) * H(N-2,X)
//
//  Norm:
//
//    Integral ( -oo < X < +oo ) exp ( - X^2 ) * H(N,X)^2 dX
//    = sqrt ( PI ) * 2^N * N!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Input, double X, the point at which the polynomials are to be evaluated.
//
//    Output, double CX[N+1], the values of the first N+1 Hermite
//    polynomials at the point X.
//
{
  int i;

  if ( n < 0 )
  {
    return;
  }

  cx[0] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  cx[1] = 2.0 * x;

  for ( i = 2; i <= n; i++ )
  {
    cx[i] = 2.0 * x * cx[i-1] - 2.0 * double( i - 1 ) * cx[i-2];
  }

  return;
}